

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O3

Col_Word Col_NewFloatWord(double value)

{
  Cell *pacVar1;
  double dVar2;
  
  dVar2 = (double)((ulong)value & 0xfffffffffffffffc);
  pacVar1 = (Cell *)((long)dVar2 + 2);
  if (!NAN(value)) {
    if ((dVar2 != value) || (NAN(dVar2) || NAN(value))) {
      pacVar1 = AllocCells(1);
      *(char *)((long)pacVar1 + 0) = '\x02';
      *(char *)((long)pacVar1 + 1) = '\0';
      *(char *)((long)pacVar1 + 2) = '\b';
      *(char *)((long)pacVar1 + 3) = '\0';
      *(char *)((long)pacVar1 + 8) = '\0';
      *(char *)((long)pacVar1 + 9) = '\0';
      *(char *)((long)pacVar1 + 10) = '\0';
      *(char *)((long)pacVar1 + 0xb) = '\0';
      *(char *)((long)pacVar1 + 0xc) = '\0';
      *(char *)((long)pacVar1 + 0xd) = '\0';
      *(char *)((long)pacVar1 + 0xe) = '\0';
      *(char *)((long)pacVar1 + 0xf) = '\0';
      *(double *)(*pacVar1 + 0x10) = value;
    }
  }
  return (Col_Word)pacVar1;
}

Assistant:

Col_Word
Col_NewFloatWord(
    double value)   /*!< Floating point value of the word to create. */
{
    Col_Word word;  /* Resulting word in the general case. */
    FloatConvert c;

    /*
     * Return immediate value if possible. The comparison of value against
     * itself detects NaN, which can also be represented as immediate value.
     */

    word = WORD_SMALLFP_NEW(value, c);
    if (value != value || WORD_SMALLFP_VALUE(word, c) == value) {
        return word;
    }

    /*
     * Create a new floating point word.
     */

    word = (Col_Word) AllocCells(1);
    WORD_FPWRAP_INIT(word, 0, value);

    return word;
}